

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_rect.cpp
# Opt level: O0

void __thiscall CUIRect::VSplitMid(CUIRect *this,CUIRect *pLeft,CUIRect *pRight,float Spacing)

{
  long lVar1;
  float *in_RDX;
  float *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float HalfSpacing;
  float Cut;
  CUIRect r;
  float local_18;
  float fStack_14;
  float local_10;
  float fStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (float)in_RDI[1];
  fVar2 = local_10 / 2.0;
  fVar3 = in_XMM0_Da / 2.0;
  fStack_c = (float)((ulong)in_RDI[1] >> 0x20);
  local_18 = (float)*in_RDI;
  fStack_14 = (float)((ulong)*in_RDI >> 0x20);
  if (in_RSI != (float *)0x0) {
    *in_RSI = local_18;
    in_RSI[1] = fStack_14;
    in_RSI[2] = fVar2 - fVar3;
    in_RSI[3] = fStack_c;
  }
  if (in_RDX != (float *)0x0) {
    *in_RDX = local_18 + fVar2 + fVar3;
    in_RDX[1] = fStack_14;
    in_RDX[2] = (local_10 - fVar2) - fVar3;
    in_RDX[3] = fStack_c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUIRect::VSplitMid(CUIRect *pLeft, CUIRect *pRight, float Spacing) const
{
	CUIRect r = *this;
	const float Cut = r.w/2;
	const float HalfSpacing = Spacing/2;

	if(pLeft)
	{
		pLeft->x = r.x;
		pLeft->y = r.y;
		pLeft->w = Cut - HalfSpacing;
		pLeft->h = r.h;
	}

	if(pRight)
	{
		pRight->x = r.x + Cut + HalfSpacing;
		pRight->y = r.y;
		pRight->w = r.w - Cut - HalfSpacing;
		pRight->h = r.h;
	}
}